

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O3

void __thiscall
IlmThread_3_4::anon_unknown_5::DefaultThreadPoolProvider::threadLoop
          (DefaultThreadPoolProvider *this,
          shared_ptr<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData> *data)

{
  element_type *peVar1;
  pointer ppTVar2;
  Task *pTVar3;
  TaskGroup *pTVar4;
  Data *pDVar5;
  shared_ptr<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData> *__stat_loc;
  unique_lock<std::mutex> taskLock;
  unique_lock<std::mutex> local_30;
  
  __stat_loc = data;
  do {
    Semaphore::wait(&((data->
                      super___shared_ptr<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->_taskSemaphore,__stat_loc);
    local_30._M_device =
         &((data->
           super___shared_ptr<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr)->_taskMutex;
    local_30._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_30);
    local_30._M_owns = true;
    peVar1 = (data->
             super___shared_ptr<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    ppTVar2 = (peVar1->_tasks).
              super__Vector_base<IlmThread_3_4::Task_*,_std::allocator<IlmThread_3_4::Task_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((peVar1->_tasks).
        super__Vector_base<IlmThread_3_4::Task_*,_std::allocator<IlmThread_3_4::Task_*>_>._M_impl.
        super__Vector_impl_data._M_start == ppTVar2) {
      if (((peVar1->_stopping)._M_base._M_i & 1U) != 0) {
        std::unique_lock<std::mutex>::~unique_lock(&local_30);
        return;
      }
    }
    else {
      pTVar3 = ppTVar2[-1];
      (peVar1->_tasks).
      super__Vector_base<IlmThread_3_4::Task_*,_std::allocator<IlmThread_3_4::Task_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppTVar2 + -1;
      std::unique_lock<std::mutex>::unlock(&local_30);
      if (pTVar3 != (Task *)0x0) {
        pTVar4 = pTVar3->_group;
        (*pTVar3->_vptr_Task[2])(pTVar3);
        (*pTVar3->_vptr_Task[1])(pTVar3);
        if (pTVar4 != (TaskGroup *)0x0) {
          pDVar5 = pTVar4->_data;
          LOCK();
          (pDVar5->numPending).super___atomic_base<int>._M_i =
               (pDVar5->numPending).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar5->numPending).super___atomic_base<int>._M_i == 0) {
            Semaphore::post(&pDVar5->isEmpty);
          }
          LOCK();
          (pDVar5->inFlight).super___atomic_base<int>._M_i =
               (pDVar5->inFlight).super___atomic_base<int>._M_i + -1;
          UNLOCK();
        }
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
  } while( true );
}

Assistant:

void
DefaultThreadPoolProvider::threadLoop (
    std::shared_ptr<DefaultThreadPoolData> data)
{
    while (true)
    {
        //
        // Wait for a task to become available
        //

        data->_taskSemaphore.wait ();

        {
            std::unique_lock<std::mutex> taskLock (data->_taskMutex);

            //
            // If there is a task pending, pop off the next task in the FIFO
            //

            if (!data->_tasks.empty ())
            {
                Task* task = data->_tasks.back ();
                data->_tasks.pop_back ();

                // release the mutex while we process
                taskLock.unlock ();

                handleProcessTask (task);

                // do not need to reacquire the lock at all since we
                // will just loop around, pull any other task
            }
            else if (data->stopped ()) { break; }
        }
    }
}